

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

wchar_t utf8_ptr::s_getch(char *p)

{
  char *p_local;
  wchar_t local_4;
  
  if (((int)*p & 0x80U) == 0) {
    local_4 = (byte)*p & 0x7f;
  }
  else if (((int)*p & 0xe0U) == 0xc0) {
    local_4 = ((byte)*p & 0x1f) * 0x40 + ((byte)p[1] & 0x3f);
  }
  else {
    local_4 = ((byte)*p & 0xf) * 0x1000 + ((byte)p[1] & 0x3f) * 0x40 + ((byte)p[2] & 0x3f);
  }
  return local_4;
}

Assistant:

static wchar_t s_getch(const char *p)
    {
        /*
         *   If the high bit is 0, it's a one-byte sequence encoding the
         *   value in the low seven bits.  
         */
        if ((*p & 0x80) == 0)
            return (((unsigned char)*p) & 0x7f);

        /*
         *   If the high two bytes are 110, it's a two-byte sequence, with
         *   the high-order 5 bits in the low 5 bits of the first byte, and
         *   the low-order six bits in the low 6 bits of the second byte.  
         */
        if ((*p & 0xE0) == 0xC0)
            return (((((unsigned char)*p) & 0x1F) << 6)
                    + (((unsigned char)*(p + 1)) & 0x3F));

        /*
         *   Otherwise, we have a three-byte sequence: the high-order 4 bits
         *   are in the low-order 5 bits of the first byte, the next 6 bits
         *   are in the low-order 6 bits of the second byte, and the
         *   low-order 6 bits are in the low-order 6 bits of the third byte.
         */
        return (((((unsigned char)*p) & 0x0F) << 12)
                + ((((unsigned char)*(p + 1)) & 0x3F) << 6)
                + (((unsigned char)*(p + 2)) & 0x3F));
    }